

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O1

int __thiscall List::printPageByNum(List *this,int currIndex)

{
  undefined8 in_RAX;
  int pageNumber;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Enter page number: ",0x13);
  std::istream::operator>>((istream *)&std::cin,&local_24);
  CheckCin();
  if ((local_24 < 1) || (this->m_listSize / this->m_pageSize < local_24)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"It is impossible to read a page with that number!",0x31);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
  }
  else {
    currIndex = printPage(this,this->m_pageSize * (local_24 + -1));
  }
  return currIndex;
}

Assistant:

int printPageByNum(int currIndex) {
        cout << "Enter page number: ";
        int pageNumber;
        cin >> pageNumber;
        CheckCin();
        if (pageNumber <= 0 || pageNumber > m_listSize / m_pageSize) {
            cout << "It is impossible to read a page with that number!" << endl;
            return currIndex;
        } else {
            currIndex = (pageNumber - 1) * m_pageSize;
            currIndex = printPage(currIndex);
        }
        return currIndex;
    }